

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P33x.h
# Opt level: O2

int GetPressureP33x(P33X *pP33x,double *pPressure)

{
  int iVar1;
  float fValue;
  
  fValue = 0.0;
  iVar1 = ReadChannelP33x(pP33x,'\x01',&fValue);
  if (iVar1 == 0) {
    *pPressure = (double)fValue;
    pP33x->LastPressure = (double)fValue;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

inline int GetPressureP33x(P33X* pP33x, double* pPressure)
{
	float fValue = 0;

	if (ReadChannelP33x(pP33x, PRESSURE_CHANNEL_P33X, &fValue) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	*pPressure = (double)fValue;

	pP33x->LastPressure = *pPressure;

	return EXIT_SUCCESS;
}